

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool TestTrimPBox(ON_BrepTrim *trim,ON_TextLog *text_log)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  char *format;
  double dVar5;
  undefined1 auVar6 [16];
  ON_3dPoint local_98;
  ON_3dPoint local_80;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  ON_Interval local_38;
  
  dVar3 = (trim->m_pbox).m_min.x;
  dVar1 = (trim->m_pbox).m_min.y;
  local_58 = (trim->m_pbox).m_min.z;
  dStack_50 = (trim->m_pbox).m_max.x;
  local_48 = (trim->m_pbox).m_max.y;
  dStack_40 = (trim->m_pbox).m_max.z;
  dVar5 = (ABS(dStack_50) + ABS(dVar3)) * 1.490116119385e-08;
  dVar2 = (ABS(local_48) + ABS(dVar1)) * 1.490116119385e-08;
  auVar6._8_4_ = SUB84(dVar2,0);
  auVar6._0_8_ = dVar5;
  auVar6._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar6 = maxpd(_DAT_006a2b80,auVar6);
  dVar1 = dVar1 - auVar6._8_8_;
  local_68._8_4_ = SUB84(dVar1,0);
  local_68._0_8_ = dVar3 - auVar6._0_8_;
  local_68._12_4_ = (int)((ulong)dVar1 >> 0x20);
  dStack_50 = auVar6._0_8_ + dStack_50;
  local_48 = auVar6._8_8_ + local_48;
  ON_Curve::PointAtStart(&local_98,(ON_Curve *)trim);
  bVar4 = ON_BoundingBox::IsPointIn((ON_BoundingBox *)local_68,&local_98,0);
  if (bVar4) {
    ON_Curve::PointAtEnd(&local_80,(ON_Curve *)trim);
    local_98.z = local_80.z;
    local_98.x = local_80.x;
    local_98.y = local_80.y;
    bVar4 = ON_BoundingBox::IsPointIn((ON_BoundingBox *)local_68,&local_98,0);
    if (bVar4) {
      (*(trim->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x25])(trim);
      local_38.m_t[1] = dVar5;
      dVar1 = ON_Interval::ParameterAt(&local_38,0.5);
      ON_Curve::PointAt(&local_80,(ON_Curve *)trim,dVar1);
      local_98.z = local_80.z;
      local_98.x = local_80.x;
      local_98.y = local_80.y;
      bVar4 = ON_BoundingBox::IsPointIn((ON_BoundingBox *)local_68,&local_98,0);
      if (bVar4) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_Brep.m_T[%d].m_pbox does not contain middle of trim.\n";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_Brep.m_T[%d].m_pbox does not contain end of trim.\n";
    }
  }
  else {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    format = "ON_Brep.m_T[%d].m_pbox does not contain start of trim.\n";
  }
  ON_TextLog::Print(text_log,format,(ulong)(uint)trim->m_trim_index);
  return false;
}

Assistant:

static
bool TestTrimPBox( const ON_BrepTrim& trim, ON_TextLog* text_log )
{
  ON_3dPoint pt;
  double d;
  ON_BoundingBox pbox = trim.m_pbox;

  
  d = ON_SQRT_EPSILON*(fabs(pbox.m_min.x)+fabs(pbox.m_max.x));
  if ( d < ON_ZERO_TOLERANCE )
    d = ON_ZERO_TOLERANCE;
  pbox.m_min.x -= d;
  pbox.m_max.x += d;

  d = ON_SQRT_EPSILON*(fabs(pbox.m_min.y)+fabs(pbox.m_max.y));
  if ( d < ON_ZERO_TOLERANCE )
    d = ON_ZERO_TOLERANCE;
  pbox.m_min.y -= d;
  pbox.m_max.y += d;

  pt = trim.PointAtStart();
  if ( !pbox.IsPointIn(pt) )
  {
    if ( text_log )
       text_log->Print("ON_Brep.m_T[%d].m_pbox does not contain start of trim.\n",trim.m_trim_index);
    return false;
  }

  pt = trim.PointAtEnd();

  if ( !pbox.IsPointIn(pt) )
  {
    if ( text_log )
       text_log->Print("ON_Brep.m_T[%d].m_pbox does not contain end of trim.\n",trim.m_trim_index);
    return false;
  }

  pt = trim.PointAt(trim.Domain().ParameterAt(0.5));
  if ( !pbox.IsPointIn(pt) )
  {
    if ( text_log )
       text_log->Print("ON_Brep.m_T[%d].m_pbox does not contain middle of trim.\n",trim.m_trim_index);
    return false;
  }

  return true;
}